

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPL3.cpp
# Opt level: O0

double __thiscall
TopCymbalOperator::getOperatorOutput
          (TopCymbalOperator *this,OPL3 *OPL3,double modulator,double externalPhase)

{
  uint uVar1;
  int iVar2;
  double (*padVar3) [1024];
  double dVar4;
  double dVar5;
  double chopped;
  double dStack_60;
  int cycles;
  double carrierOutput;
  double modulatorOutput;
  double modulatorPhase;
  double carrierPhase;
  double *waveform;
  int waveIndex;
  double envelopeInDB;
  double externalPhase_local;
  double modulator_local;
  OPL3 *OPL3_local;
  TopCymbalOperator *this_local;
  
  dVar4 = EnvelopeGenerator::getEnvelope
                    (&(this->super_Operator).envelopeGenerator,OPL3,(this->super_Operator).egt,
                     (this->super_Operator).am);
  dVar4 = EnvelopeFromDB(dVar4);
  (this->super_Operator).envelope = dVar4;
  dVar4 = PhaseGenerator::getPhase((PhaseGenerator *)this,OPL3,(this->super_Operator).vib);
  (this->super_Operator).phase = dVar4;
  uVar1 = (this->super_Operator).ws;
  iVar2 = OPL3->_new;
  padVar3 = ::OPL3::OperatorData->waveforms;
  dVar5 = (this->super_Operator).phase * 8.0;
  dVar4 = Operator::getOutput(&this->super_Operator,0.0,externalPhase,
                              padVar3[(int)(uVar1 & iVar2 * 4 + 3U)]);
  dStack_60 = Operator::getOutput(&this->super_Operator,dVar4,dVar5,
                                  padVar3[(int)(uVar1 & iVar2 * 4 + 3U)]);
  dVar5 = dVar5 * 4.0;
  dVar4 = floor(dVar5 / 4.0);
  if (0.1 < dVar5 - dVar4 * 4.0) {
    dStack_60 = 0.0;
  }
  return dStack_60 * 2.0;
}

Assistant:

double TopCymbalOperator::getOperatorOutput(OPL3 *OPL3, double modulator, double externalPhase) {
	double envelopeInDB = envelopeGenerator.getEnvelope(OPL3, egt, am);
	envelope = EnvelopeFromDB(envelopeInDB);
	
	phase = phaseGenerator.getPhase(OPL3, vib);
	
	int waveIndex = ws & ((OPL3->_new<<2) + 3); 
	double *waveform = OPL3::OperatorData->waveforms[waveIndex];
	
	// Empirically tested multiplied phase for the Top Cymbal:
	double carrierPhase = 8 * phase;
	double modulatorPhase = externalPhase;
	double modulatorOutput = getOutput(Operator::noModulator, modulatorPhase, waveform);
	double carrierOutput = getOutput(modulatorOutput, carrierPhase, waveform);
	
	int cycles = 4;
	double chopped = (carrierPhase * cycles) /* %cycles */;
	chopped = chopped - floor(chopped / cycles) * cycles;
	if( chopped > 0.1) carrierOutput = 0;
	
	return carrierOutput*2;  
}